

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicPlatformDebug.cpp
# Opt level: O1

char * Diligent::BasicPlatformDebug::TextColorToTextColorCode
                 (DEBUG_MESSAGE_SEVERITY Severity,TextColor Color)

{
  char *pcVar1;
  
  pcVar1 = "\x1b[39m";
  switch(Color) {
  case Auto:
    if (Severity - DEBUG_MESSAGE_SEVERITY_WARNING < 3) {
      pcVar1 = &DAT_00927ad8 +
               *(int *)(&DAT_00927ad8 + (ulong)(Severity - DEBUG_MESSAGE_SEVERITY_WARNING) * 4);
    }
    break;
  case Black:
    return "\x1b[30m";
  case DarkRed:
    return "\x1b[31m";
  case DarkGreen:
    return "\x1b[32m";
  case DarkYellow:
    return "\x1b[33m";
  case DarkBlue:
    return "\x1b[34m";
  case DarkMagenta:
    return "\x1b[35m";
  case DarkCyan:
    return "\x1b[36m";
  case DarkGray:
    return "\x1b[90m";
  case Red:
    return "\x1b[91m";
  case Green:
    return "\x1b[92m";
  case Yellow:
    return "\x1b[93m";
  case Blue:
    return "\x1b[94m";
  case Magenta:
    return "\x1b[95m";
  case Cyan:
    return "\x1b[96m";
  case White:
    return "\x1b[97m";
  }
  return pcVar1;
}

Assistant:

const char* BasicPlatformDebug::TextColorToTextColorCode(DEBUG_MESSAGE_SEVERITY Severity, TextColor Color)
{
    switch (Color)
    {
        case TextColor::Auto:
        {
            switch (Severity)
            {
                case DEBUG_MESSAGE_SEVERITY_INFO:
                    return TextColorCode::Default;

                case DEBUG_MESSAGE_SEVERITY_WARNING:
                    return TextColorCode::Yellow;

                case DEBUG_MESSAGE_SEVERITY_ERROR:
                case DEBUG_MESSAGE_SEVERITY_FATAL_ERROR:
                    return TextColorCode::Red;

                default:
                    return TextColorCode::Default;
            }
        }
#define TEX_COLOR_TO_CODE(Color) \
    case TextColor::Color: return TextColorCode::Color

            TEX_COLOR_TO_CODE(Default);

            TEX_COLOR_TO_CODE(Black);
            TEX_COLOR_TO_CODE(DarkRed);
            TEX_COLOR_TO_CODE(DarkGreen);
            TEX_COLOR_TO_CODE(DarkYellow);
            TEX_COLOR_TO_CODE(DarkBlue);
            TEX_COLOR_TO_CODE(DarkMagenta);
            TEX_COLOR_TO_CODE(DarkCyan);
            TEX_COLOR_TO_CODE(DarkGray);

            TEX_COLOR_TO_CODE(Red);
            TEX_COLOR_TO_CODE(Green);
            TEX_COLOR_TO_CODE(Yellow);
            TEX_COLOR_TO_CODE(Blue);
            TEX_COLOR_TO_CODE(Magenta);
            TEX_COLOR_TO_CODE(Cyan);
            TEX_COLOR_TO_CODE(White);
#undef TEX_COLOR_TO_CODE

        default:
            return TextColorCode::Default;
    }
}